

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O3

status asio::detail::
       reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>::
       do_perform(reactor_op *base)

{
  bool bVar1;
  status sVar2;
  bufs_type bufs;
  buffer_sequence_adapter<asio::const_buffer,_asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
  bStack_428;
  
  buffer_sequence_adapter<asio::const_buffer,_asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
  ::buffer_sequence_adapter
            (&bStack_428,
             (prepared_buffers<asio::const_buffer,_64UL> *)&base[1].super_operation.func_);
  bVar1 = socket_ops::non_blocking_send
                    (*(socket_type *)&base[1].super_operation.next_,bStack_428.buffers_,
                     bStack_428.count_,base[5].super_operation.task_result_,&base->ec_,
                     &base->bytes_transferred_);
  sVar2 = not_done;
  if ((bVar1) && (sVar2 = done, ((ulong)base[1].super_operation.next_ & 0x1000000000) != 0)) {
    sVar2 = done_and_exhausted;
    if (bStack_428.total_buffer_size_ <= base->bytes_transferred_) {
      sVar2 = (uint)bVar1;
    }
  }
  return sVar2;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_send_op_base* o(
        static_cast<reactive_socket_send_op_base*>(base));

    typedef buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence> bufs_type;

    status result;
    if (bufs_type::is_single_buffer)
    {
      result = socket_ops::non_blocking_send1(o->socket_,
          bufs_type::first(o->buffers_).data(),
          bufs_type::first(o->buffers_).size(), o->flags_,
          o->ec_, o->bytes_transferred_) ? done : not_done;

      if (result == done)
        if ((o->state_ & socket_ops::stream_oriented) != 0)
          if (o->bytes_transferred_ < bufs_type::first(o->buffers_).size())
            result = done_and_exhausted;
    }
    else
    {
      bufs_type bufs(o->buffers_);
      result = socket_ops::non_blocking_send(o->socket_,
            bufs.buffers(), bufs.count(), o->flags_,
            o->ec_, o->bytes_transferred_) ? done : not_done;

      if (result == done)
        if ((o->state_ & socket_ops::stream_oriented) != 0)
          if (o->bytes_transferred_ < bufs.total_size())
            result = done_and_exhausted;
    }

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_send",
          o->ec_, o->bytes_transferred_));

    return result;
  }